

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# str_split.cc
# Opt level: O2

string_view __thiscall absl::lts_20250127::ByChar::Find(ByChar *this,string_view text,size_t pos)

{
  undefined1 auVar1 [16];
  size_type __pos;
  basic_string_view<char,_std::char_traits<char>_> bVar2;
  string_view sVar3;
  string_view text_local;
  
  text_local._M_str = text._M_str;
  text_local._M_len = text._M_len;
  __pos = std::basic_string_view<char,_std::char_traits<char>_>::find(&text_local,this->c_,pos);
  if (__pos == 0xffffffffffffffff) {
    auVar1._8_8_ = 0;
    auVar1._0_8_ = text_local._M_str + text_local._M_len;
    bVar2 = (basic_string_view<char,_std::char_traits<char>_>)(auVar1 << 0x40);
  }
  else {
    bVar2 = std::basic_string_view<char,_std::char_traits<char>_>::substr(&text_local,__pos,1);
  }
  sVar3._M_len = bVar2._M_len;
  sVar3._M_str = bVar2._M_str;
  return sVar3;
}

Assistant:

absl::string_view ByChar::Find(absl::string_view text, size_t pos) const {
  size_t found_pos = text.find(c_, pos);
  if (found_pos == absl::string_view::npos)
    return absl::string_view(text.data() + text.size(), 0);
  return text.substr(found_pos, 1);
}